

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O2

void __thiscall
flow::lang::ScopedSym::ScopedSym
          (ScopedSym *this,Type t,SymbolTable *outer,string *name,SourceLocation *loc)

{
  _Alloc_hider local_20;
  
  local_20._M_p = (pointer)outer;
  Symbol::Symbol(&this->super_Symbol,t,name,loc);
  (this->super_Symbol).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ScopedSym_001ae7f8;
  std::make_unique<flow::lang::SymbolTable,flow::lang::SymbolTable*&,std::__cxx11::string_const&>
            ((SymbolTable **)&this->scope_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20);
  return;
}

Assistant:

ScopedSym(Type t, SymbolTable* outer, const std::string& name,
            const SourceLocation& loc)
      : Symbol(t, name, loc), scope_(std::make_unique<SymbolTable>(outer, name)) {}